

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

RCOError __thiscall RCO::loadElement(RCO *this,RCOElement *el,uint32_t offset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t count;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  RCOElement first_child;
  RCOElement local_a0;
  
  puVar4 = this->mBuffer;
  count = *(uint32_t *)(puVar4 + (ulong)offset + 4);
  iVar2 = *(int *)(puVar4 + (ulong)offset + 0x10);
  iVar3 = *(int *)(puVar4 + (ulong)offset + 0x14);
  getStringTableString(this,&el->name,*(uint32_t *)(puVar4 + offset));
  loadAttributes(this,el,offset + 0x1c,count);
  if (iVar3 != -1) {
    paVar1 = &local_a0.name.field_2;
    local_a0.name._M_string_length = 0;
    local_a0.name.field_2._M_local_buf[0] = '\0';
    local_a0.originalSize = 0;
    local_a0.attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_a0._97_8_ = 0;
    local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    loadElement(this,&local_a0,iVar3 + (this->mHeader).tree_start_off);
    std::vector<RCOElement,_std::allocator<RCOElement>_>::push_back(&el->children,&local_a0);
    std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector(&local_a0.children);
    std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector(&local_a0.siblings);
    std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::~vector(&local_a0.attributes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.name._M_dataplus._M_p);
    }
  }
  if (iVar2 != -1) {
    paVar1 = &local_a0.name.field_2;
    local_a0.name._M_string_length = 0;
    local_a0.name.field_2._M_local_buf[0] = '\0';
    local_a0.originalSize = 0;
    local_a0.attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    local_a0.children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_a0._97_8_ = 0;
    local_a0.name._M_dataplus._M_p = (pointer)paVar1;
    loadElement(this,&local_a0,iVar2 + (this->mHeader).tree_start_off);
    std::vector<RCOElement,_std::allocator<RCOElement>_>::push_back(&el->siblings,&local_a0);
    std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector(&local_a0.children);
    std::vector<RCOElement,_std::allocator<RCOElement>_>::~vector(&local_a0.siblings);
    std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::~vector(&local_a0.attributes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.name._M_dataplus._M_p);
    }
  }
  return NO_ERROR;
}

Assistant:

RCOError RCO::loadElement(RCOElement &el, uint32_t offset)
{
	RCOError err;

	rco_tree_table_element element;

	memcpy(&element, mBuffer + offset, sizeof(rco_tree_table_element));

	uint32_t root_attr_offset = offset + sizeof(rco_tree_table_element);

	err = getStringTableString(el.name, element.element_offset);

	if (err != NO_ERROR)
		return err;

	err = loadAttributes(el, root_attr_offset, element.attr_ct);

	if (err != NO_ERROR)
		return err;

	if (element.first_child != 0xFFFFFFFF)
	{
		RCOElement first_child;
		err = loadElement(first_child, mHeader.tree_start_off + element.first_child);
		if (err != NO_ERROR)
			return err;
		el.children.push_back(first_child);
	}

	if (element.next_sibling != 0xFFFFFFFF)
	{
		RCOElement next_sibling;
		err = loadElement(next_sibling, mHeader.tree_start_off + element.next_sibling);
		if (err != NO_ERROR)
			return err;
		el.siblings.push_back(next_sibling);
	}

	return err;
}